

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::block_number_limits
               (NegativeTestContext *ctx)

{
  uint glShaderType;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *this;
  bool bVar1;
  ShaderType shaderType;
  int iVar2;
  GLenum in_ECX;
  GLenum in_R8D;
  long lVar3;
  long lVar4;
  string source;
  string fragSource;
  string vertSource;
  string tessEvalSource;
  string tessControlSource;
  value_type local_328;
  uint local_308;
  value_type local_300;
  uint local_2e0;
  value_type local_2d8;
  string local_2b8;
  uint local_298;
  value_type local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_270;
  string local_268;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_228;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *local_220;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *local_218;
  string local_210;
  string local_1f0;
  string local_1d0 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_158;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  deUint32 local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  undefined1 uStack_108;
  ProgramSources local_100;
  
  NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
            (&local_248,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8b31,in_ECX);
  NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
            (&local_268,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8b30,in_ECX);
  NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8e88,in_ECX);
  NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8e87,in_ECX);
  local_220 = &local_140;
  local_270 = &local_120;
  local_218 = &local_100.attribLocationBindings;
  local_228 = &local_100.transformFeedbackVaryings;
  lVar3 = 0;
  do {
    local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"maxShaderStorageBlocks: Exceed limits","");
    NegativeTestContext::beginSection(ctx,local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
      operator_delete(local_1d0[0]._M_dataplus._M_p,local_1d0[0].field_2._M_allocated_capacity + 1);
    }
    glShaderType = (&DAT_01cd5ca0)[lVar3];
    shaderType = getGLUShaderType(glShaderType);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      iVar2 = getMaxSSBlockSize(ctx,glShaderType);
      NegativeTestShared::(anonymous_namespace)::genBlockSource_abi_cxx11_
                (&local_2b8,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(long)(iVar2 + 1),
                 (ulong)glShaderType,in_R8D);
      *(undefined8 *)
       ((long)&(local_270->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
      *(undefined8 *)
       ((long)&(local_270->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
      (local_270->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_270->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      memset(local_1d0,0,0xac);
      if (iVar2 != 0) {
        if ((int)glShaderType < 0x8e87) {
          if (glShaderType == 0x8b30) {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,local_248._M_dataplus._M_p,
                       local_248._M_dataplus._M_p + local_248._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1d0,&local_328);
            local_308 = 1;
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_2b8._M_dataplus._M_p,
                       local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_308 * 3),&local_300);
LAB_016a52d0:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_016a52ec;
          }
          if (glShaderType == 0x8b31) {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,local_2b8._M_dataplus._M_p,
                       local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1d0,&local_328);
            local_308 = 1;
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_268._M_dataplus._M_p,
                       local_268._M_dataplus._M_p + local_268._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_308 * 3),&local_300);
            goto LAB_016a52d0;
          }
          if (glShaderType == 0x8dd9) {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,local_248._M_dataplus._M_p,
                       local_248._M_dataplus._M_p + local_248._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1d0,&local_328);
            local_308 = 1;
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_268._M_dataplus._M_p,
                       local_268._M_dataplus._M_p + local_268._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_308 * 3),&local_300);
            local_2e0 = 2;
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d8,local_2b8._M_dataplus._M_p,
                       local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_2e0 * 3),&local_2d8);
            goto LAB_016a52b4;
          }
        }
        else {
          if (glShaderType == 0x8e87) {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,local_248._M_dataplus._M_p,
                       local_248._M_dataplus._M_p + local_248._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1d0,&local_328);
            local_308 = 1;
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_268._M_dataplus._M_p,
                       local_268._M_dataplus._M_p + local_268._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_308 * 3),&local_300);
            local_2e0 = 3;
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d8,local_1f0._M_dataplus._M_p,
                       local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_2e0 * 3),&local_2d8);
            local_298 = 4;
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_290,local_2b8._M_dataplus._M_p,
                       local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_298 * 3),&local_290);
LAB_016a528f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
LAB_016a52b4:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_016a52d0;
          }
          if (glShaderType == 0x8e88) {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,local_248._M_dataplus._M_p,
                       local_248._M_dataplus._M_p + local_248._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1d0,&local_328);
            local_308 = 1;
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_268._M_dataplus._M_p,
                       local_268._M_dataplus._M_p + local_268._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_308 * 3),&local_300);
            local_2e0 = 3;
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d8,local_2b8._M_dataplus._M_p,
                       local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_2e0 * 3),&local_2d8);
            local_298 = 4;
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_290,local_210._M_dataplus._M_p,
                       local_210._M_dataplus._M_p + local_210._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(&local_1d0[0]._M_dataplus + (ulong)local_298 * 3),&local_290);
            goto LAB_016a528f;
          }
          if (glShaderType != 0x91b9) goto LAB_016a5308;
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_328,local_2b8._M_dataplus._M_p,
                     local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&vStack_158,&local_328);
LAB_016a52ec:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
        }
LAB_016a5308:
        lVar4 = 0;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&local_100.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar4),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&local_1d0[0]._M_dataplus._M_p + lVar4));
          this = local_218;
          lVar4 = lVar4 + 0x18;
        } while (lVar4 != 0x90);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
                  (local_218,local_220);
        local_100.transformFeedbackBufferMode = local_128;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_228,local_270);
        local_100.separable = (bool)uStack_108;
        verifyProgram(ctx,&local_100);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_228);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(this);
        lVar4 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
      }
      NegativeTestContext::endSection(ctx);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_270);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (local_220);
      lVar4 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&local_1d0[0]._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      NegativeTestContext::endSection(ctx);
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 6) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void block_number_limits (NegativeTestContext& ctx)
{
	const glw::GLenum glShaderTypes[] =
	{
		GL_VERTEX_SHADER,
		GL_FRAGMENT_SHADER,
		GL_TESS_CONTROL_SHADER,
		GL_TESS_EVALUATION_SHADER,
		GL_GEOMETRY_SHADER,
		GL_COMPUTE_SHADER,
	};

	const std::string	vertSource			= genCommonSource(ctx, GL_VERTEX_SHADER);
	const std::string	fragSource			= genCommonSource(ctx, GL_FRAGMENT_SHADER);
	const std::string	tessControlSource	= genCommonSource(ctx, GL_TESS_CONTROL_SHADER);
	const std::string	tessEvalSource		= genCommonSource(ctx, GL_TESS_EVALUATION_SHADER);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(glShaderTypes); ndx++)
	{
		ctx.beginSection("maxShaderStorageBlocks: Exceed limits");

		if (!ctx.isShaderSupported(static_cast<glu::ShaderType>(getGLUShaderType(glShaderTypes[ndx]))))
		{
			ctx.endSection();
			continue;
		}

		int					maxSSBlocks			= getMaxSSBlockSize(ctx, glShaderTypes[ndx]);
		std::string			source				= genBlockSource(ctx, maxSSBlocks+1, glShaderTypes[ndx]);

		glu::ProgramSources sources;

		if (maxSSBlocks == 0)
		{
			ctx.endSection();
			continue;
		}

		switch (glShaderTypes[ndx])
		{
			case GL_VERTEX_SHADER:
				sources << glu::VertexSource(source)
						<< glu::FragmentSource(fragSource);
				break;

			case GL_FRAGMENT_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(source);
				break;

			case GL_TESS_CONTROL_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::TessellationControlSource(source)
						<< glu::TessellationEvaluationSource(tessEvalSource);
				break;

			case GL_TESS_EVALUATION_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::TessellationControlSource(tessControlSource)
						<< glu::TessellationEvaluationSource(source);
				break;

			case GL_GEOMETRY_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::GeometrySource(source);
				break;

			case GL_COMPUTE_SHADER:
				sources << glu::ComputeSource(source);
				break;

			default:
				DE_FATAL("Unknown shader type");
				break;
		}

		verifyProgram(ctx, sources);
		ctx.endSection();
	}
}